

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O0

int is_hex(char *p,size_t len)

{
  size_t len_local;
  char *p_local;
  
  len_local = len;
  p_local = p;
  while( true ) {
    if (len_local == 0) {
      return 1;
    }
    if ((((*p_local < '0') || ('9' < *p_local)) && ((*p_local < 'a' || ('f' < *p_local)))) &&
       ((*p_local < 'A' || ('F' < *p_local)))) break;
    p_local = p_local + 1;
    len_local = len_local - 1;
  }
  return 0;
}

Assistant:

static int
is_hex(const char *p, size_t len)
{
	while (len-- > 0) {
		if ((*p >= '0' && *p <= '9')
		    || (*p >= 'a' && *p <= 'f')
		    || (*p >= 'A' && *p <= 'F'))
			++p;
		else
			return (0);
	}
	return (1);
}